

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O1

pair<pstore::index::details::index_pointer,_bool> __thiscall
pstore::index::
hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
::insert_node<std::pair<std::__cxx11::string,pstore::extent<char>>>
          (hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
           *this,transaction_base *transaction,index_pointer node,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
          *value,hash_type hash,uint shifts,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents,
          bool is_upsert)

{
  size_t __n;
  undefined1 auVar1 [12];
  int iVar2;
  ulong uVar3;
  index_pointer iVar4;
  undefined7 uVar5;
  pair<pstore::index::details::index_pointer,_bool> pVar6;
  index_pointer node_local;
  key_type existing_key;
  database *local_40;
  index_pointer local_38;
  
  node_local = node;
  if (((ulong)node.internal_ & 1) != 0) {
    if (shifts < 0x42) {
      pVar6 = insert_into_internal<std::pair<std::__cxx11::string,pstore::extent<char>>>
                        (this,transaction,node,value,hash,shifts,parents,is_upsert);
      auVar1 = pVar6._0_12_;
    }
    else {
      pVar6 = insert_into_linear<std::pair<std::__cxx11::string,pstore::extent<char>>>
                        (this,transaction,node,value,parents,is_upsert);
      auVar1 = pVar6._0_12_;
    }
    iVar4 = auVar1._0_8_;
    uVar3 = (ulong)auVar1._8_4_;
    goto LAB_0015efce;
  }
  if (((ulong)node.internal_ & 2) != 0) {
    __assert_fail("is_address ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                  ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
  }
  local_40 = transaction->db_;
  local_38 = node;
  serialize::read<std::__cxx11::string,pstore::serialize::archive::database_reader>
            (&existing_key,(serialize *)&local_40,(database_reader *)node.internal_);
  __n = (value->first)._M_string_length;
  if (__n == existing_key._M_string_length) {
    if (__n != 0) {
      iVar2 = bcmp((value->first)._M_dataplus._M_p,existing_key._M_dataplus._M_p,__n);
      if (iVar2 != 0) goto LAB_0015ef2f;
    }
    uVar5 = (undefined7)((ulong)this >> 8);
    if (is_upsert) {
      iVar4.addr_.a_ =
           store_leaf_node<std::pair<std::__cxx11::string,pstore::extent<char>>>
                     (this,transaction,value,parents);
      uVar3 = CONCAT71(uVar5,1);
    }
    else {
      uVar3 = (parents.ptr_)->elements_;
      if (0xc < uVar3) {
        assert_failed("elements_ < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                      ,100);
      }
      (parents.ptr_)->elements_ = uVar3 + 1;
      ((parents.ptr_)->c_)._M_elems[uVar3].node = node_local;
      ((parents.ptr_)->c_)._M_elems[uVar3].position = 0xffffffffffffffff;
      uVar3 = CONCAT71(uVar5,1);
      iVar4 = node_local;
    }
  }
  else {
LAB_0015ef2f:
    uVar3 = std::_Hash_bytes(existing_key._M_dataplus._M_p,existing_key._M_string_length,0xc70f6907)
    ;
    iVar4 = insert_into_leaf<std::pair<std::__cxx11::string,pstore::extent<char>>>
                      (this,transaction,&node_local,value,uVar3 >> ((byte)shifts & 0x3f),hash,shifts
                       ,parents);
    uVar3 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)existing_key._M_dataplus._M_p != &existing_key.field_2) {
    operator_delete(existing_key._M_dataplus._M_p,existing_key.field_2._M_allocated_capacity + 1);
  }
LAB_0015efce:
  pVar6._8_8_ = uVar3 & 0xffffffff;
  pVar6.first.internal_ = iVar4.internal_;
  return pVar6;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_node (
            transaction_base & transaction, index_pointer const node, OtherValueType const & value,
            hash_type hash, unsigned shifts, gsl::not_null<parent_stack *> parents, bool is_upsert)
            -> std::pair<index_pointer, bool> {

            index_pointer result;
            bool key_exists = false;
            if (node.is_leaf ()) { // This node is a leaf node.
                key_type const existing_key =
                    get_key (transaction.db (), node.to_address ()); // Read key.
                if (equal_ (value.first, existing_key)) {
                    if (is_upsert) {
                        result = this->store_leaf_node (transaction, value, parents);
                    } else {
                        parents->push (details::parent_type{node});
                        result = node;
                    }
                    key_exists = true;
                } else {
                    auto const existing_hash =
                        static_cast<hash_type> ((hash_ (existing_key) >> shifts));
                    result = this->insert_into_leaf (transaction, node, value, existing_hash, hash,
                                                     shifts, parents);
                }
            } else {
                // This node is an internal or a linear node.
                if (details::depth_is_internal_node (shifts)) {
                    std::tie (result, key_exists) = this->insert_into_internal (
                        transaction, node, value, hash, shifts, parents, is_upsert);
                } else {
                    std::tie (result, key_exists) =
                        this->insert_into_linear (transaction, node, value, parents, is_upsert);
                }
            }

            return std::make_pair (result, key_exists);
        }